

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

void __thiscall
cmCPackIFWRepository::WriteRepositoryUpdate(cmCPackIFWRepository *this,cmXMLWriter *xout)

{
  ulong uVar1;
  allocator<char> local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xout_local;
  cmCPackIFWRepository *this_local;
  
  local_18 = xout;
  xout_local = (cmXMLWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Repository",&local_39);
  cmXMLWriter::StartElement(xout,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  switch(this->Update) {
  case None:
    break;
  case Add:
    cmXMLWriter::Attribute<char[4]>(local_18,"action",(char (*) [4])0xc79f81);
    break;
  case Remove:
    cmXMLWriter::Attribute<char[7]>(local_18,"action",(char (*) [7])0xc79f63);
    break;
  case Replace:
    cmXMLWriter::Attribute<char[8]>(local_18,"action",(char (*) [8])"replace");
  }
  if ((this->Update == Add) || (this->Update == Remove)) {
    cmXMLWriter::Attribute<std::__cxx11::string>(local_18,"url",&this->Url);
  }
  else if (this->Update == Replace) {
    cmXMLWriter::Attribute<std::__cxx11::string>(local_18,"oldUrl",&this->OldUrl);
    cmXMLWriter::Attribute<std::__cxx11::string>(local_18,"newUrl",&this->NewUrl);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(local_18,"enabled",&this->Enabled);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(local_18,"username",&this->Username);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(local_18,"password",&this->Password);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(local_18,"displayname",&this->DisplayName);
  }
  cmXMLWriter::EndElement(local_18);
  return;
}

Assistant:

void cmCPackIFWRepository::WriteRepositoryUpdate(cmXMLWriter& xout) const
{
  xout.StartElement("Repository");

  switch (this->Update) {
    case cmCPackIFWRepository::None:
      break;
    case cmCPackIFWRepository::Add:
      xout.Attribute("action", "add");
      break;
    case cmCPackIFWRepository::Remove:
      xout.Attribute("action", "remove");
      break;
    case cmCPackIFWRepository::Replace:
      xout.Attribute("action", "replace");
      break;
  }

  // Url
  if (this->Update == cmCPackIFWRepository::Add ||
      this->Update == cmCPackIFWRepository::Remove) {
    xout.Attribute("url", this->Url);
  } else if (this->Update == cmCPackIFWRepository::Replace) {
    xout.Attribute("oldUrl", this->OldUrl);
    xout.Attribute("newUrl", this->NewUrl);
  }
  // Enabled
  if (!this->Enabled.empty()) {
    xout.Attribute("enabled", this->Enabled);
  }
  // Username
  if (!this->Username.empty()) {
    xout.Attribute("username", this->Username);
  }
  // Password
  if (!this->Password.empty()) {
    xout.Attribute("password", this->Password);
  }
  // DisplayName
  if (!this->DisplayName.empty()) {
    xout.Attribute("displayname", this->DisplayName);
  }

  xout.EndElement();
}